

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

int gen_neon_unzip(TCGContext_conflict1 *tcg_ctx,int rd,int rm,int size,int q)

{
  TCGv_ptr arg1;
  TCGv_ptr arg2;
  TCGv_ptr pm;
  TCGv_ptr pd;
  int q_local;
  int size_local;
  int rm_local;
  int rd_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if ((q == 0) && (size == 2)) {
    tcg_ctx_local._4_4_ = 1;
  }
  else {
    arg1 = vfp_reg_ptr(tcg_ctx,true,rd);
    arg2 = vfp_reg_ptr(tcg_ctx,true,rm);
    if (q == 0) {
      if (size == 0) {
        gen_helper_neon_unzip8(tcg_ctx,arg1,arg2);
      }
      else {
        if (size != 1) {
          abort();
        }
        gen_helper_neon_unzip16(tcg_ctx,arg1,arg2);
      }
    }
    else if (size == 0) {
      gen_helper_neon_qunzip8(tcg_ctx,arg1,arg2);
    }
    else if (size == 1) {
      gen_helper_neon_qunzip16(tcg_ctx,arg1,arg2);
    }
    else {
      if (size != 2) {
        abort();
      }
      gen_helper_neon_qunzip32(tcg_ctx,arg1,arg2);
    }
    tcg_temp_free_ptr(tcg_ctx,arg1);
    tcg_temp_free_ptr(tcg_ctx,arg2);
    tcg_ctx_local._4_4_ = 0;
  }
  return tcg_ctx_local._4_4_;
}

Assistant:

static int gen_neon_unzip(TCGContext *tcg_ctx, int rd, int rm, int size, int q)
{
    TCGv_ptr pd, pm;
    
    if (!q && size == 2) {
        return 1;
    }
    pd = vfp_reg_ptr(tcg_ctx, true, rd);
    pm = vfp_reg_ptr(tcg_ctx, true, rm);
    if (q) {
        switch (size) {
        case 0:
            gen_helper_neon_qunzip8(tcg_ctx, pd, pm);
            break;
        case 1:
            gen_helper_neon_qunzip16(tcg_ctx, pd, pm);
            break;
        case 2:
            gen_helper_neon_qunzip32(tcg_ctx, pd, pm);
            break;
        default:
            abort();
        }
    } else {
        switch (size) {
        case 0:
            gen_helper_neon_unzip8(tcg_ctx, pd, pm);
            break;
        case 1:
            gen_helper_neon_unzip16(tcg_ctx, pd, pm);
            break;
        default:
            abort();
        }
    }
    tcg_temp_free_ptr(tcg_ctx, pd);
    tcg_temp_free_ptr(tcg_ctx, pm);
    return 0;
}